

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_fill(jit_State *J,TRef trdst,TRef trlen,TRef trfill,CTSize step)

{
  uint len_00;
  MSize mlp_00;
  TRef TVar1;
  int32_t k;
  CTSize len;
  MSize mlp;
  CRecMemList ml [16];
  uint local_6c;
  CTSize step_local;
  TRef trfill_local;
  TRef trlen_local;
  TRef trdst_local;
  jit_State *J_local;
  
  if ((trlen & 0xffff) < 0x8000) {
    len_00 = (J->cur).ir[trlen & 0xffff].field_1.op12;
    if (len_00 == 0) {
      return;
    }
    if ((len_00 < 0x81) && (mlp_00 = crec_fill_unroll((CRecMemList *)&len,len_00,8), mlp_00 != 0)) {
      if (((trfill & 0xffff) < 0x8000) || (local_6c = trfill, mlp != 0x10)) {
        (J->fold).ins.field_0.ot = 0x5b13;
        (J->fold).ins.field_0.op1 = (IRRef1)trfill;
        (J->fold).ins.field_0.op2 = 0x270;
        local_6c = lj_opt_fold(J);
      }
      if (mlp != 0x10) {
        if (mlp == 0x16) {
          if ((local_6c & 0xffff) < 0x8000) {
            (J->fold).ins.field_0.ot = 0x5b16;
            (J->fold).ins.field_0.op1 = (IRRef1)local_6c;
            (J->fold).ins.field_0.op2 = 0x2d4;
            local_6c = lj_opt_fold(J);
          }
          TVar1 = lj_ir_kint64(J,0x101010101010101);
          (J->fold).ins.field_0.ot = 0x2b16;
          (J->fold).ins.field_0.op1 = (IRRef1)local_6c;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
          local_6c = lj_opt_fold(J);
        }
        else {
          k = 0x1010101;
          if (mlp == 0x12) {
            k = 0x101;
          }
          TVar1 = lj_ir_kint(J,k);
          (J->fold).ins.field_0.ot = 0x2b13;
          (J->fold).ins.field_0.op1 = (IRRef1)local_6c;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
          local_6c = lj_opt_fold(J);
        }
      }
      crec_fill_emit(J,(CRecMemList *)&len,mlp_00,trdst,local_6c);
      goto LAB_001b68ea;
    }
  }
  lj_ir_call(J,IRCALL_memset,(ulong)trdst,(ulong)trfill,(ulong)trlen);
LAB_001b68ea:
  (J->fold).ins.field_0.ot = 0x5a00;
  (J->fold).ins.field_0.op1 = 0;
  (J->fold).ins.field_0.op2 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_fill(jit_State *J, TRef trdst, TRef trlen, TRef trfill,
		      CTSize step)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_FILL_MAXUNROLL];
    MSize mlp;
    CTSize len = (CTSize)IR(tref_ref(trlen))->i;
    if (len == 0) return;  /* Shortcut. */
    if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
      step = CTSIZE_PTR;
    if (step * CREC_FILL_MAXUNROLL < len) goto fallback;
    mlp = crec_fill_unroll(ml, len, step);
    if (!mlp) goto fallback;
    if (tref_isk(trfill) || ml[0].tp != IRT_U8)
      trfill = emitconv(trfill, IRT_INT, IRT_U8, 0);
    if (ml[0].tp != IRT_U8) {  /* Scatter U8 to U16/U32/U64. */
      if (CTSIZE_PTR == 8 && ml[0].tp == IRT_U64) {
	if (tref_isk(trfill))  /* Pointless on x64 with zero-extended regs. */
	  trfill = emitconv(trfill, IRT_U64, IRT_U32, 0);
	trfill = emitir(IRT(IR_MUL, IRT_U64), trfill,
			lj_ir_kint64(J, U64x(01010101,01010101)));
      } else {
	trfill = emitir(IRTI(IR_MUL), trfill,
		   lj_ir_kint(J, ml[0].tp == IRT_U16 ? 0x0101 : 0x01010101));
      }
    }
    crec_fill_emit(J, ml, mlp, trdst, trfill);
  } else {
fallback:
    /* Call memset. Always needs a barrier to disable alias analysis. */
    lj_ir_call(J, IRCALL_memset, trdst, trfill, trlen);  /* Note: arg order! */
  }
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}